

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Debug.cpp
# Opt level: O3

void anon_unknown.dwarf_2d9845::set_cb
               (Caliper *c,ChannelBody *param_2,Attribute *attr,Variant *value)

{
  int iVar1;
  ostream *poVar2;
  string local_240;
  undefined1 local_220 [248];
  ios_base local_128 [264];
  int local_20;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)(anonymous_namespace)::dbg_mutex);
  if (iVar1 == 0) {
    poVar2 = (ostream *)local_220;
    std::ofstream::ofstream(poVar2);
    local_20 = 1;
    iVar1 = cali::Log::verbosity();
    if (local_20 <= iVar1) {
      poVar2 = cali::Log::get_stream((Log *)local_220);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Event: pre_set (",0x10);
    cali::Attribute::name_abi_cxx11_(&local_240,attr);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,local_240._M_dataplus._M_p,local_240._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"=",1);
    poVar2 = cali::operator<<(poVar2,value);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,")\n",2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
    }
    local_220._0_8_ = _VTT;
    *(undefined8 *)(local_220 + *(long *)(_VTT + -0x18)) = ___throw_bad_array_new_length;
    std::filebuf::~filebuf((filebuf *)(local_220 + 8));
    std::ios_base::~ios_base(local_128);
    pthread_mutex_unlock((pthread_mutex_t *)(anonymous_namespace)::dbg_mutex);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void set_cb(Caliper* c, ChannelBody*, const Attribute& attr, const Variant& value)
{
    std::lock_guard<std::mutex> lock(dbg_mutex);
    Log(1).stream() << "Event: pre_set (" << attr.name() << "=" << value << ")\n";
}